

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl.cpp
# Opt level: O0

size_t arbiter::http::anon_unknown_4::headerCb(char *buffer,size_t size,size_t num,Headers *out)

{
  long lVar1;
  mapped_type *this;
  string local_140 [8];
  string val;
  string key;
  size_t split;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  undefined8 local_e0;
  char local_d1;
  char *local_d0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  undefined8 local_a0;
  char local_91;
  char *local_90;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  undefined8 local_78 [3];
  allocator local_59;
  string local_58 [8];
  string data;
  size_t fullBytes;
  Headers *out_local;
  size_t num_local;
  size_t size_local;
  char *buffer_local;
  
  data.field_2._8_8_ = size * num;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_58,buffer,size * num,&local_59);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_59);
  local_88._M_current = (char *)::std::__cxx11::string::begin();
  local_90 = (char *)::std::__cxx11::string::end();
  local_91 = '\n';
  local_80 = ::std::remove<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                       (local_88,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )local_90,&local_91);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)local_78,&local_80);
  local_a8._M_current = (char *)::std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_a0,&local_a8);
  local_b0 = ::std::__cxx11::string::erase(local_58,local_78[0],local_a0);
  local_c8._M_current = (char *)::std::__cxx11::string::begin();
  local_d0 = (char *)::std::__cxx11::string::end();
  local_d1 = '\r';
  local_c0 = ::std::remove<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                       (local_c8,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )local_d0,&local_d1);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_b8,&local_c0);
  local_e8._M_current = (char *)::std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_e0,&local_e8);
  ::std::__cxx11::string::erase(local_58,local_b8,local_e0);
  lVar1 = ::std::__cxx11::string::find_first_of((char *)local_58,0x2614e7);
  if (lVar1 == -1) {
    buffer_local = (char *)data.field_2._8_8_;
  }
  else {
    ::std::__cxx11::string::substr((ulong)((long)&val.field_2 + 8),(ulong)local_58);
    ::std::__cxx11::string::size();
    ::std::__cxx11::string::substr((ulong)local_140,(ulong)local_58);
    this = drivers::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)out,(key_type *)((long)&val.field_2 + 8));
    ::std::__cxx11::string::operator=((string *)this,local_140);
    buffer_local = (char *)data.field_2._8_8_;
    ::std::__cxx11::string::~string(local_140);
    ::std::__cxx11::string::~string((string *)(val.field_2._M_local_buf + 8));
  }
  ::std::__cxx11::string::~string(local_58);
  return (size_t)buffer_local;
}

Assistant:

std::size_t headerCb(
            const char *buffer,
            std::size_t size,
            std::size_t num,
            http::Headers* out)
    {
        const std::size_t fullBytes(size * num);

        std::string data(buffer, fullBytes);
        data.erase(std::remove(data.begin(), data.end(), '\n'), data.end());
        data.erase(std::remove(data.begin(), data.end(), '\r'), data.end());

        const std::size_t split(data.find_first_of(":"));

        // No colon means it isn't a header with data.
        if (split == std::string::npos) return fullBytes;

        const std::string key(data.substr(0, split));
        const std::string val(data.substr(split + 1, data.size()));

        (*out)[key] = val;

        return fullBytes;
    }